

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psstack.c
# Opt level: O3

FT_Fast cf2_stack_popInt(CF2_Stack stack)

{
  CF2_StackNumber *pCVar1;
  int *piVar2;
  
  pCVar1 = stack->top;
  if (pCVar1 == stack->buffer) {
    piVar2 = stack->error;
    if ((piVar2 != (int *)0x0) && (*piVar2 == 0)) {
      *piVar2 = 0xa1;
      return 0;
    }
  }
  else {
    if (pCVar1[-1].type == CF2_NumberInt) {
      stack->top = pCVar1 + -1;
      return pCVar1[-1].u.i;
    }
    piVar2 = stack->error;
    if ((piVar2 != (int *)0x0) && (*piVar2 == 0)) {
      *piVar2 = 0xa0;
      return 0;
    }
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( CF2_Int )
  cf2_stack_popInt( CF2_Stack  stack )
  {
    if ( stack->top == stack->buffer )
    {
      CF2_SET_ERROR( stack->error, Stack_Underflow );
      return 0;   /* underflow */
    }
    if ( stack->top[-1].type != CF2_NumberInt )
    {
      CF2_SET_ERROR( stack->error, Syntax_Error );
      return 0;   /* type mismatch */
    }

    stack->top--;

    return stack->top->u.i;
  }